

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O0

void od_ec_enc_init(od_ec_enc *enc,uint32_t size)

{
  uchar *puVar1;
  uint in_ESI;
  od_ec_enc *in_RDI;
  
  od_ec_enc_reset(in_RDI);
  puVar1 = (uchar *)malloc((ulong)in_ESI);
  in_RDI->buf = puVar1;
  in_RDI->storage = in_ESI;
  if ((in_ESI != 0) && (in_RDI->buf == (uchar *)0x0)) {
    in_RDI->storage = 0;
    in_RDI->error = -1;
  }
  return;
}

Assistant:

void od_ec_enc_init(od_ec_enc *enc, uint32_t size) {
  od_ec_enc_reset(enc);
  enc->buf = (unsigned char *)malloc(sizeof(*enc->buf) * size);
  enc->storage = size;
  if (size > 0 && enc->buf == NULL) {
    enc->storage = 0;
    enc->error = -1;
  }
}